

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetBindFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,Uint32 BindFlags,char *Delimiter)

{
  ulong uVar1;
  Char *pCVar2;
  undefined4 in_register_00000014;
  undefined1 local_60 [8];
  string msg;
  Uint32 Flag;
  allocator local_21;
  char *local_20;
  char *Delimiter_local;
  String *pSStack_10;
  Uint32 BindFlags_local;
  String *Str;
  
  local_20 = (char *)CONCAT44(in_register_00000014,BindFlags);
  Delimiter_local._4_4_ = (uint)this;
  pSStack_10 = __return_storage_ptr__;
  if (Delimiter_local._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    for (msg.field_2._12_4_ = 1; Delimiter_local._4_4_ != 0 && (uint)msg.field_2._12_4_ < 0x801;
        msg.field_2._12_4_ = msg.field_2._12_4_ << 1) {
      if ((Delimiter_local._4_4_ & msg.field_2._12_4_) != 0) {
        uVar1 = std::__cxx11::string::empty();
        if ((uVar1 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_20);
        }
        pCVar2 = GetBindFlagString(msg.field_2._12_4_);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pCVar2);
        Delimiter_local._4_4_ = (msg.field_2._12_4_ ^ 0xffffffff) & Delimiter_local._4_4_;
      }
    }
    if (Delimiter_local._4_4_ != 0) {
      FormatString<char[24]>((string *)local_60,(char (*) [24])"Unknown bind flags left");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"GetBindFlagsString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x4af);
      std::__cxx11::string::~string((string *)local_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetBindFlagsString(Uint32 BindFlags, const char* Delimiter)
{
    if (BindFlags == 0)
        return "0";
    String Str;
    for (Uint32 Flag = 1; BindFlags && Flag <= BIND_FLAG_LAST; Flag <<= 1)
    {
        if (BindFlags & Flag)
        {
            if (!Str.empty())
                Str += Delimiter;
            Str += GetBindFlagString(Flag);
            BindFlags &= ~Flag;
        }
    }
    VERIFY(BindFlags == 0, "Unknown bind flags left");
    return Str;
}